

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O1

int __thiscall ncnn::YoloDetectionOutput::create_pipeline(YoloDetectionOutput *this,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  Option opt_cpu;
  ParamDict pd;
  ParamDict local_5b8;
  
  pLVar3 = create_layer(0x20);
  this->softmax = pLVar3;
  ParamDict::ParamDict(&local_5b8);
  ParamDict::set(&local_5b8,0,0);
  (*this->softmax->_vptr_Layer[2])(this->softmax,&local_5b8);
  (*this->softmax->_vptr_Layer[4])();
  lVar4 = 0x560;
  do {
    piVar1 = *(int **)((long)&local_5b8.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_5b8.params[0].loaded + lVar4);
        plVar2 = *(long **)((long)&local_5b8.params[0].v.packing + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_5b8.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_5b8.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_5b8.params[0].loaded + lVar4) = 0;
    *(undefined8 *)((long)&local_5b8.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&local_5b8.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&local_5b8.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_5b8.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return 0;
}

Assistant:

int YoloDetectionOutput::create_pipeline(const Option& opt)
{
    {
        softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

        ncnn::ParamDict pd;
        pd.set(0, 0);// axis

        softmax->load_param(pd);

        Option opt_cpu = opt;
        opt_cpu.vulkan_compute = false;
        softmax->create_pipeline(opt_cpu);
    }

    return 0;
}